

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

ostream * operator<<(ostream *out,MD5 md5)

{
  ostream *poVar1;
  string local_30;
  
  MD5::hexdigest_abi_cxx11_(&local_30,&md5);
  poVar1 = std::operator<<(out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, MD5 md5)
{
  return out << md5.hexdigest();
}